

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O0

btScalar __thiscall btSoftBody::getTotalMass(btSoftBody *this)

{
  int iVar1;
  long in_RDI;
  btScalar bVar2;
  int i;
  btScalar mass;
  int iVar3;
  int iVar4;
  float fVar5;
  
  fVar5 = 0.0;
  iVar3 = 0;
  while( true ) {
    iVar4 = iVar3;
    iVar1 = btAlignedObjectArray<btSoftBody::Node>::size
                      ((btAlignedObjectArray<btSoftBody::Node> *)(in_RDI + 0x370));
    if (iVar1 <= iVar3) break;
    bVar2 = getMass((btSoftBody *)CONCAT44(fVar5,iVar4),(int)((ulong)in_RDI >> 0x20));
    fVar5 = bVar2 + fVar5;
    iVar3 = iVar4 + 1;
  }
  return fVar5;
}

Assistant:

btScalar		btSoftBody::getTotalMass() const
{
	btScalar	mass=0;
	for(int i=0;i<m_nodes.size();++i)
	{
		mass+=getMass(i);
	}
	return(mass);
}